

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O1

DdHashItem * cuddHashTableAlloc(DdHashTable *hash)

{
  int *piVar1;
  char *__ptr;
  DdManager *pDVar2;
  DdSubtable *pDVar3;
  DdHashItem *pDVar4;
  _func_void_long *p_Var5;
  DdHashItem **ppDVar6;
  int iVar7;
  long lVar8;
  ulong __size;
  ulong uVar9;
  
  p_Var5 = Extra_UtilMMoutOfMemory;
  if (hash->nextFree == (DdHashItem *)0x0) {
    uVar9 = (ulong)hash->itemsize;
    Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
    __size = (ulong)(hash->itemsize * 0x3ff);
    ppDVar6 = (DdHashItem **)malloc(__size);
    Extra_UtilMMoutOfMemory = p_Var5;
    if (ppDVar6 == (DdHashItem **)0x0) {
      __ptr = hash->manager->stash;
      if (__ptr == (char *)0x0) {
        ppDVar6 = (DdHashItem **)0x0;
      }
      else {
        free(__ptr);
        pDVar2 = hash->manager;
        pDVar2->stash = (char *)0x0;
        pDVar2->maxCacheHard = pDVar2->cacheSlots - 1;
        pDVar2->cacheSlack = ~pDVar2->cacheSlots;
        iVar7 = pDVar2->size;
        if (0 < (long)iVar7) {
          pDVar3 = pDVar2->subtables;
          lVar8 = 0;
          do {
            piVar1 = (int *)((long)&pDVar3->maxKeys + lVar8);
            *piVar1 = *piVar1 << 2;
            lVar8 = lVar8 + 0x38;
          } while ((long)iVar7 * 0x38 - lVar8 != 0);
        }
        pDVar2->gcFrac = 0.2;
        pDVar2->minDead = (uint)(long)((double)pDVar2->slots * 0.2);
        ppDVar6 = (DdHashItem **)malloc(__size);
      }
      if (ppDVar6 == (DdHashItem **)0x0) {
        (*Extra_UtilMMoutOfMemory)(__size);
        hash->manager->errorCode = CUDD_MEMORY_OUT;
        return (DdHashItem *)0x0;
      }
    }
    *ppDVar6 = (DdHashItem *)hash->memoryList;
    hash->memoryList = ppDVar6;
    hash->nextFree = (DdHashItem *)((long)ppDVar6 + uVar9);
    iVar7 = 0x3fd;
    do {
      *(ulong *)((long)ppDVar6 + uVar9) = (long)ppDVar6 + uVar9 * 2;
      ppDVar6 = (DdHashItem **)((long)ppDVar6 + uVar9);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    *(undefined8 *)((long)ppDVar6 + uVar9) = 0;
  }
  pDVar4 = hash->nextFree;
  hash->nextFree = pDVar4->next;
  return pDVar4;
}

Assistant:

DD_INLINE
static DdHashItem *
cuddHashTableAlloc(
  DdHashTable * hash)
{
    int i;
    unsigned int itemsize = hash->itemsize;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    DdHashItem **mem, *thisOne, *next, *item;

    if (hash->nextFree == NULL) {
        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
        mem = (DdHashItem **) ABC_ALLOC(char,(DD_MEM_CHUNK+1) * itemsize);
        MMoutOfMemory = saveHandler;
#ifdef __osf__
#pragma pointer_size restore
#endif
        if (mem == NULL) {
            if (hash->manager->stash != NULL) {
                ABC_FREE(hash->manager->stash);
                hash->manager->stash = NULL;
                /* Inhibit resizing of tables. */
                hash->manager->maxCacheHard = hash->manager->cacheSlots - 1;
                hash->manager->cacheSlack = - (int) (hash->manager->cacheSlots + 1);
                for (i = 0; i < hash->manager->size; i++) {
                    hash->manager->subtables[i].maxKeys <<= 2;
                }
                hash->manager->gcFrac = 0.2;
                hash->manager->minDead =
                    (unsigned) (0.2 * (double) hash->manager->slots);
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
                mem = (DdHashItem **) ABC_ALLOC(char,(DD_MEM_CHUNK+1) * itemsize);
#ifdef __osf__
#pragma pointer_size restore
#endif
            }
            if (mem == NULL) {
                (*MMoutOfMemory)((long)((DD_MEM_CHUNK + 1) * itemsize));
                hash->manager->errorCode = CUDD_MEMORY_OUT;
                return(NULL);
            }
        }

        mem[0] = (DdHashItem *) hash->memoryList;
        hash->memoryList = mem;

        thisOne = (DdHashItem *) ((char *) mem + itemsize);
        hash->nextFree = thisOne;
        for (i = 1; i < DD_MEM_CHUNK; i++) {
            next = (DdHashItem *) ((char *) thisOne + itemsize);
            thisOne->next = next;
            thisOne = next;
        }

        thisOne->next = NULL;

    }
    item = hash->nextFree;
    hash->nextFree = item->next;
    return(item);

}